

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.h
# Opt level: O0

void m2v_toggle_el(m2v *M,int r,int c)

{
  int iVar1;
  int bit_in_base;
  m2v_base mVar2;
  int in_EDX;
  int in_ESI;
  m2v *in_RDI;
  m2v_base m;
  int b;
  int w;
  
  iVar1 = m2v__get_word(in_RDI,in_ESI,in_EDX);
  bit_in_base = m2v__get_bit(in_RDI,in_EDX);
  mVar2 = m2v__get_mask(bit_in_base);
  in_RDI->e[iVar1] = mVar2 ^ in_RDI->e[iVar1];
  return;
}

Assistant:

inline void m2v_toggle_el(m2v* M, int r, int c)
{
	assert(0 <= r && r < M->n_row);
	assert(0 <= c && c < M->n_col);
	const int w = m2v__get_word(M, r, c);
	const int b = m2v__get_bit(M, c);
	const m2v_base m = m2v__get_mask(b);
	M->e[w] ^= m;
}